

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * __thiscall pugi::xml_node::child_value(xml_node *this)

{
  xml_node_struct *pxVar1;
  xml_node_struct **ppxVar2;
  
  pxVar1 = this->_root;
  if (pxVar1 != (xml_node_struct *)0x0) {
    if (((pxVar1->header & 0xf) == 2) && (pxVar1->value != (char_t *)0x0)) {
      return pxVar1->value;
    }
    ppxVar2 = &pxVar1->first_child;
    while (pxVar1 = *ppxVar2, pxVar1 != (xml_node_struct *)0x0) {
      if ((((uint)pxVar1->header & 0xf) - 3 < 2) && (pxVar1->value != (char_t *)0x0)) {
        return pxVar1->value;
      }
      ppxVar2 = &pxVar1->next_sibling;
    }
  }
  return "";
}

Assistant:

PUGI__FN const char_t* xml_node::child_value() const
	{
		if (!_root) return PUGIXML_TEXT("");

		// element nodes can have value if parse_embed_pcdata was used
		if (PUGI__NODETYPE(_root) == node_element && _root->value)
			return _root->value;

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (impl::is_text_node(i) && i->value)
				return i->value;

		return PUGIXML_TEXT("");
	}